

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AMReX_VisMF.cpp
# Opt level: O0

string * amrex::VisMF::BaseName(string *filename)

{
  char *pcVar1;
  string *in_RSI;
  string *in_RDI;
  char *slash;
  allocator local_19;
  char *local_18;
  string *local_10;
  
  local_10 = in_RSI;
  pcVar1 = (char *)std::__cxx11::string::c_str();
  local_18 = strrchr(pcVar1,0x2f);
  if (local_18 == (char *)0x0) {
    std::__cxx11::string::string((string *)in_RDI,local_10);
  }
  else {
    pcVar1 = local_18 + 1;
    std::allocator<char>::allocator();
    std::__cxx11::string::string((string *)in_RDI,pcVar1,&local_19);
    std::allocator<char>::~allocator((allocator<char> *)&local_19);
  }
  return in_RDI;
}

Assistant:

std::string
VisMF::BaseName (const std::string& filename)
{
    BL_ASSERT(filename[filename.length() - 1] != '/');

    if(const char *slash = strrchr(filename.c_str(), '/')) {
        //
        // Got at least one slash -- return the following tail.
        //
        return std::string(slash + 1);
    } else {
        //
        // No leading directory portion to name.
        //
        return filename;
    }
}